

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPSender.hpp
# Opt level: O3

void __thiscall Statsd::UDPSender::queueMessage(UDPSender *this,string *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ulong uVar2;
  _Elt_pointer pbVar3;
  bool bVar4;
  unique_lock<std::mutex> batchingLock;
  unique_lock<std::mutex> local_20;
  
  bVar4 = (this->m_batchingThread)._M_id._M_thread == 0;
  if (bVar4) {
    local_20._M_device = (mutex *)0x0;
  }
  else {
    local_20._M_device = &this->m_batchingMutex;
    local_20._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_20);
  }
  local_20._M_owns = !bVar4;
  pbVar3 = (this->m_batchingMessageQueue).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar3 == (this->m_batchingMessageQueue).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_00107532:
    if (pbVar3 == (this->m_batchingMessageQueue).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_push_back_aux<>(&this->m_batchingMessageQueue);
      pbVar3 = (this->m_batchingMessageQueue).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    }
    else {
      (pbVar3->_M_dataplus)._M_p = (pointer)&pbVar3->field_2;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      pbVar3 = (this->m_batchingMessageQueue).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      (this->m_batchingMessageQueue).
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur = pbVar3;
    }
    if (pbVar3 == (this->m_batchingMessageQueue).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pbVar3 = (this->m_batchingMessageQueue).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    std::__cxx11::string::reserve((ulong)(pbVar3 + -1));
  }
  else {
    if (pbVar3 == (this->m_batchingMessageQueue).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pbVar1 = (this->m_batchingMessageQueue).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
      uVar2 = pbVar1[0xf]._M_string_length;
      if (this->m_batchsize < uVar2) goto LAB_00107532;
      if (uVar2 == 0) goto LAB_001075c2;
      pbVar3 = pbVar1 + 0x10;
    }
    else {
      if (this->m_batchsize < pbVar3[-1]._M_string_length) goto LAB_00107532;
      if (pbVar3[-1]._M_string_length == 0) goto LAB_001075c2;
    }
    std::__cxx11::string::push_back((char)pbVar3 + -0x20);
  }
LAB_001075c2:
  pbVar3 = (this->m_batchingMessageQueue).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar3 == (this->m_batchingMessageQueue).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar3 = (this->m_batchingMessageQueue).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  std::__cxx11::string::_M_append((char *)(pbVar3 + -1),(ulong)(message->_M_dataplus)._M_p);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

inline void UDPSender::queueMessage(const std::string& message) noexcept {
    // We aquire a lock but only if we actually need to (i.e. there is a thread also accessing the queue)
    auto batchingLock =
        m_batchingThread.joinable() ? std::unique_lock<std::mutex>(m_batchingMutex) : std::unique_lock<std::mutex>();
    // Either we don't have a place to batch our message or we exceeded the batch size, so make a new batch
    if (m_batchingMessageQueue.empty() || m_batchingMessageQueue.back().length() > m_batchsize) {
        m_batchingMessageQueue.emplace_back();
        m_batchingMessageQueue.back().reserve(m_batchsize + 256);
    }  // When there is already a batch open we need a separator when its not empty
    else if (!m_batchingMessageQueue.back().empty()) {
        m_batchingMessageQueue.back().push_back('\n');
    }
    // Add the new message to the batch
    m_batchingMessageQueue.back().append(message);
}